

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamHeader_p.cpp
# Opt level: O0

void __thiscall
BamTools::Internal::BamHeader::ReadHeaderLength(BamHeader *this,BgzfStream *stream,uint32_t *length)

{
  bool bVar1;
  uint uVar2;
  undefined8 uVar3;
  uint *in_RDX;
  size_t numBytesRead;
  char buffer [4];
  allocator local_81;
  string local_80 [8];
  size_t in_stack_ffffffffffffff88;
  string *in_stack_ffffffffffffff90;
  BgzfStream *in_stack_ffffffffffffff98;
  BamException *in_stack_ffffffffffffffa0;
  allocator local_49;
  string local_48 [32];
  size_t local_28;
  uint *local_18;
  
  local_18 = in_RDX;
  local_28 = BgzfStream::Read(in_stack_ffffffffffffff98,(char *)in_stack_ffffffffffffff90,
                              in_stack_ffffffffffffff88);
  if (local_28 == 4) {
    uVar2 = UnpackUnsignedInt((char *)0x288fc2);
    *local_18 = uVar2;
    bVar1 = SystemIsBigEndian();
    if (bVar1) {
      SwapEndian_32(local_18);
    }
    return;
  }
  uVar3 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_48,"BamHeader::ReadHeaderLength",&local_49);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"could not read header length",&local_81);
  BamException::BamException
            (in_stack_ffffffffffffffa0,(string *)in_stack_ffffffffffffff98,in_stack_ffffffffffffff90
            );
  __cxa_throw(uVar3,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamHeader::ReadHeaderLength(BgzfStream* stream, uint32_t& length)
{

    // read BAM header text length
    char buffer[sizeof(uint32_t)];
    const std::size_t numBytesRead = stream->Read(buffer, sizeof(uint32_t));
    if (numBytesRead != sizeof(uint32_t))
        throw BamException("BamHeader::ReadHeaderLength", "could not read header length");

    // convert char buffer to length
    length = BamTools::UnpackUnsignedInt(buffer);
    if (BamTools::SystemIsBigEndian()) BamTools::SwapEndian_32(length);
}